

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serve_static_content.hpp
# Opt level: O0

error_or<int> * __thiscall
pstore::http::details::
read_and_send<(anonymous_namespace)::ServeStaticContent::serve_path(std::__cxx11::string_const&)const::__0,int>
          (error_or<int> *__return_storage_ptr__,details *this,anon_class_8_1_4c539acc sender,int io
          ,descriptor *fd)

{
  uint uVar1;
  bool bVar2;
  pointer first;
  size_type __nbytes;
  ssize_t sVar3;
  undefined4 in_register_0000000c;
  descriptor *this_00;
  anon_class_8_1_4c539acc sender_00;
  anon_class_8_1_4c539acc sender_01;
  descriptor local_498;
  details *local_488;
  undefined4 local_480;
  span<const_unsigned_char,__1L> local_470;
  details *local_460;
  undefined1 local_458 [8];
  error_or<int> eo;
  size_t num_read;
  value_type_conflict *data;
  array<unsigned_char,_1024UL> buffer;
  descriptor *fd_local;
  details *pdStack_18;
  int io_local;
  anon_class_8_1_4c539acc sender_local;
  
  this_00 = (descriptor *)CONCAT44(in_register_0000000c,io);
  fd_local._4_4_ = (uint)sender.actual;
  buffer._M_elems._1016_8_ = this_00;
  pdStack_18 = this;
  sender_local.actual = (string *)__return_storage_ptr__;
  memset(&data,0,0x400);
  first = std::array<unsigned_char,_1024UL>::data((array<unsigned_char,_1024UL> *)&data);
  pstore::gsl::not_null<void_*>::not_null((not_null<void_*> *)&eo.has_error_,first);
  __nbytes = std::array<unsigned_char,_1024UL>::size((array<unsigned_char,_1024UL> *)&data);
  sVar3 = pstore::romfs::descriptor::read(this_00,eo._16_4_,(void *)0x1,__nbytes);
  uVar1 = fd_local._4_4_;
  if (sVar3 == 0) {
    error_or<int>::error_or<int&,void>(__return_storage_ptr__,(int *)((long)&fd_local + 4));
  }
  else {
    local_460 = pdStack_18;
    pstore::gsl::span<const_unsigned_char,_-1L>::span(&local_470,first,first + sVar3);
    sender_00.actual._4_4_ = 0;
    sender_00.actual._0_4_ = uVar1;
    send<(anonymous_namespace)::ServeStaticContent::serve_path(std::__cxx11::string_const&)const::__0,int>
              ((error_or<int> *)local_458,(http *)local_460,sender_00,(int)&local_470,
               (span<const_unsigned_char,__1L> *)fd);
    bVar2 = pstore::error_or::operator_cast_to_bool((error_or *)local_458);
    uVar1 = fd_local._4_4_;
    if (bVar2) {
      local_488 = pdStack_18;
      pstore::romfs::descriptor::descriptor(&local_498,this_00);
      sender_01.actual._4_4_ = 0;
      sender_01.actual._0_4_ = uVar1;
      read_and_send<(anonymous_namespace)::ServeStaticContent::serve_path(std::__cxx11::string_const&)const::__0,int>
                (__return_storage_ptr__,local_488,sender_01,(int)&local_498,fd);
      pstore::romfs::descriptor::~descriptor(&local_498);
    }
    else {
      error_or<int>::error_or(__return_storage_ptr__,(error_or<int> *)local_458);
    }
    local_480 = 1;
    error_or<int>::~error_or((error_or<int> *)local_458);
  }
  return __return_storage_ptr__;
}

Assistant:

pstore::error_or<IO> read_and_send (Sender sender, IO io,
                                                pstore::romfs::descriptor fd) {
                std::array<std::uint8_t, 1024> buffer{{0}};
                auto * const data = buffer.data ();
                std::size_t const num_read =
                    fd.read (data, sizeof (decltype (buffer)::value_type), buffer.size ());
                if (num_read == 0) {
                    return pstore::error_or<IO>{io};
                }
                pstore::error_or<IO> const eo =
                    send (sender, io, gsl::span<std::uint8_t const> (data, data + num_read));
                if (!eo) {
                    return eo;
                }
                return read_and_send (sender, io, fd);
            }